

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

void __thiscall addrman_tests::addrman_update_address::test_method(addrman_update_address *this)

{
  size_type *psVar1;
  long lVar2;
  __single_object _Var3;
  readonly_property65 rVar4;
  bool bVar5;
  int32_t consistency_check_ratio;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> this_00;
  time_point tVar6;
  long lVar7;
  duration dVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  long in_FS_OFFSET;
  const_string file;
  initializer_list<CAddress> __l;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  initializer_list<CAddress> __l_00;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  initializer_list<CAddress> __l_01;
  const_string file_16;
  const_string file_17;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  check_type cVar14;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  undefined4 local_56c;
  ServiceFlags local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  vector<CAddress,_std::allocator<CAddress>_> vAddr6;
  char *local_528;
  char *local_520;
  NodeSeconds local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  vector<CAddress,_std::allocator<CAddress>_> vAddr5;
  char *local_4a0;
  char *local_498;
  NodeSeconds local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  vector<CAddress,_std::allocator<CAddress>_> vAddr4;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  assertion_result local_3f8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  vector<CAddress,_std::allocator<CAddress>_> vAddr3;
  char *local_3a0;
  char *local_398;
  NodeSeconds local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  vector<CAddress,_std::allocator<CAddress>_> vAddr2;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  vector<CAddress,_std::allocator<CAddress>_> vAddr1;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  __single_object addrman;
  undefined1 local_208 [8];
  assertion_result local_200;
  direct_or_indirect *local_1e8;
  undefined1 local_1e0 [8];
  direct_or_indirect local_1d8;
  assertion_result local_1c8;
  direct_or_indirect local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a0;
  uint16_t local_190;
  NodeSeconds local_188;
  ServiceFlags SStack_180;
  direct_or_indirect local_178;
  uint local_168;
  Network local_160;
  uint32_t uStack_15c;
  uint16_t local_158;
  CAddress addr_v2;
  direct_or_indirect local_118;
  uint local_108;
  Network local_100;
  uint32_t uStack_fc;
  uint16_t local_f8;
  CAddress addr_diff_port;
  direct_or_indirect local_b8;
  uint local_a8;
  Network local_a0;
  uint32_t uStack_9c;
  uint16_t local_98;
  CAddress addr;
  CNetAddr source;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   consistency_check_ratio);
  psVar1 = &addr.super_CService.super_CNetAddr.m_addr._size;
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"252.2.2.2","");
  ResolveIP(&source,(string *)&addr);
  if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar1) {
    operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                             addr.super_CService.super_CNetAddr.m_addr._size) + 1);
  }
  psVar1 = &addr_diff_port.super_CService.super_CNetAddr.m_addr._size;
  addr_diff_port.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr_diff_port,"250.1.1.1","");
  ResolveService((CService *)&local_b8.indirect_contents,(string *)&addr_diff_port,0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents);
  addr.super_CService.super_CNetAddr.m_net = local_a0;
  addr.super_CService.super_CNetAddr.m_scope_id = uStack_9c;
  addr.super_CService.port = local_98;
  addr.nTime.__d.__r = (duration)100000000;
  addr.nServices = NODE_NONE;
  if (0x10 < local_a8) {
    free(local_b8.indirect_contents.indirect);
    local_b8.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)
      addr_diff_port.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar1) {
    operator_delete(addr_diff_port.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
                    indirect,addr_diff_port.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  tVar6 = NodeClock::now();
  lVar7 = -((long)tVar6.__d.__r >> 0x3f);
  lVar10 = (long)tVar6.__d.__r / 1000000000 + ((long)tVar6.__d.__r >> 0x3f);
  dVar8.__r = lVar7 + lVar10 + -10000;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x43c;
  file.m_begin = (iterator)&local_220;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  addr.nTime.__d.__r = (duration)(duration)dVar8.__r;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_230,msg);
  _Var3 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_diff_port,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  addr_diff_port.super_CService.super_CNetAddr.m_net = addr.super_CService.super_CNetAddr.m_net;
  addr_diff_port.super_CService.super_CNetAddr.m_scope_id =
       addr.super_CService.super_CNetAddr.m_scope_id;
  addr_diff_port.super_CService.port = addr.super_CService.port;
  addr_diff_port.nTime = addr.nTime;
  addr_diff_port.nServices = addr.nServices;
  __l._M_len = 1;
  __l._M_array = &addr_diff_port;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_200,__l,
             (allocator_type *)&local_1c8);
  _cVar14 = 0x24df1b;
  rVar4.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add((AddrMan *)
                    _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (vector<CAddress,_std::allocator<CAddress>_> *)&local_200,&source,(seconds)0x0);
  local_1b0.direct[0] = (char)rVar4.super_readonly_property<bool>.super_class_property<bool>.value;
  local_1b0._8_8_ = (element_type *)0x0;
  aStack_1a0._M_allocated_capacity = 0;
  addr_v2.super_CService.super_CNetAddr._24_8_ = &local_3f8;
  local_3f8._0_8_ = "addrman->Add({addr}, source)";
  local_3f8.m_message.px = (element_type *)0xe543c6;
  addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_238 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1b0,(lazy_ostream *)&addr_v2,1,0,WARN,_cVar14,
             (size_t)&local_240,0x43c,dVar8.__r,lVar7,lVar10);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1a0);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_200);
  if (0x10 < addr_diff_port.super_CService.super_CNetAddr.m_addr._size) {
    free(addr_diff_port.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr_diff_port.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)0x0;
  }
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x43d;
  file_00.m_begin = (iterator)&local_250;
  msg_00.m_end = pvVar13;
  msg_00.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_260,
             msg_00);
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abb30;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_1a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)AddrMan::Size((AddrMan *)
                                    addrman._M_t.
                                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>
                                    .super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                    (optional<Network>)0x0,(optional<bool>)0x0);
  local_1c8._0_8_ = &vAddr2;
  vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&vAddr3;
  local_200.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x1);
  vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  local_200.m_message.px = (element_type *)0x0;
  local_200.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3f8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3f8.m_message.px = (element_type *)0xe52ae3;
  addr_diff_port.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr_diff_port.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr_diff_port.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_v2.super_CService.super_CNetAddr._24_8_ = &vAddr1;
  addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_diff_port.super_CService.super_CNetAddr._24_8_ = (allocator_type *)&local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_200,(lazy_ostream *)&local_1b0,1,2,REQUIRE,0xe52afd,(size_t)&local_3f8,0x43d,
             &addr_diff_port,"1U",&addr_v2);
  boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
  psVar1 = &addr_v2.super_CService.super_CNetAddr.m_addr._size;
  addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr_v2,"250.1.1.1","");
  ResolveService((CService *)&local_118.indirect_contents,(string *)&addr_v2,0x208e);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_diff_port,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_118.indirect_contents);
  addr_diff_port.super_CService.super_CNetAddr.m_net = local_100;
  addr_diff_port.super_CService.super_CNetAddr.m_scope_id = uStack_fc;
  addr_diff_port.super_CService.port = local_f8;
  addr_diff_port.nTime.__d.__r = (duration)100000000;
  addr_diff_port.nServices = NODE_NONE;
  if (0x10 < local_108) {
    free(local_118.indirect_contents.indirect);
    local_118.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar1) {
    operator_delete(addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  addr_diff_port.nTime.__d.__r = (duration)(duration)dVar8.__r;
  tVar6 = NodeClock::now();
  AddrMan::Connected((AddrMan *)
                     _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                     super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                     &addr_diff_port.super_CService,(NodeSeconds)((long)tVar6.__d.__r / 1000000000))
  ;
  AddrMan::SetServices
            ((AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr_diff_port.super_CService,
             NODE_NETWORK_LIMITED);
  pvVar12 = (iterator)0x0;
  pvVar13 = (iterator)0x1;
  AddrMan::GetAddr(&vAddr1,(AddrMan *)
                           addrman._M_t.
                           super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                           super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                           super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x445;
  file_01.m_begin = (iterator)&local_288;
  msg_01.m_end = pvVar13;
  msg_01.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_298,
             msg_01);
  local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
  local_200._0_8_ = &PTR__lazy_ostream_013abb30;
  local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e8 = (direct_or_indirect *)0xf6cf21;
  vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(((long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                        (long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                              .super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&vAddr4;
  vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&vAddr5;
  vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  local_3f8.m_message.px = (element_type *)0x0;
  local_3f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x7d;
  local_1c8._1_7_ = 0xe52a;
  local_1c8.m_message.px = (element_type *)0xe52ae3;
  addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_v2.super_CService.super_CNetAddr._24_8_ = &vAddr2;
  local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abbb0;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_1a0._8_8_ = &vAddr3;
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_start == 0x38);
  boost::test_tools::tt_detail::report_assertion
            (&local_3f8,(lazy_ostream *)&local_200,1,2,REQUIRE,0xe5366d,(size_t)&local_1c8,0x445,
             &addr_v2,"1U",(lazy_ostream *)&local_1b0);
  boost::detail::shared_count::~shared_count(&local_3f8.m_message.pn);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar14 = 0x24e471;
  file_02.m_end = (iterator)0x446;
  file_02.m_begin = (iterator)&local_2a8;
  msg_02.m_end = pvVar13;
  msg_02.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2b8,
             msg_02);
  if (vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data
      ._M_finish ==
      vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00250459;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    lVar11 = extraout_RDX;
LAB_0024fd65:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00250459;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               (lVar11 >> 3) * 0x6db6db6db6db6db7);
    lVar11 = extraout_RDX_00;
LAB_0024fd9e:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00250459;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               (lVar11 >> 3) * 0x6db6db6db6db6db7);
    lVar7 = extraout_RDX_01;
LAB_0024fdd7:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00250459;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               (lVar7 >> 3) * 0x6db6db6db6db6db7);
    lVar7 = extraout_RDX_02;
LAB_0024fe10:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00250459;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               (lVar7 >> 3) * 0x6db6db6db6db6db7);
    lVar7 = extraout_RDX_03;
LAB_0024fe49:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00250459;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               (lVar7 >> 3) * 0x6db6db6db6db6db7);
    lVar7 = extraout_RDX_04;
LAB_0024fe82:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00250459;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               (lVar7 >> 3) * 0x6db6db6db6db6db7);
    lVar7 = extraout_RDX_05;
  }
  else {
    local_1b0.direct[0] =
         ((vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
           super__Vector_impl_data._M_start)->nTime).__d.__r == dVar8.__r;
    local_1b0._8_8_ = (element_type *)0x0;
    aStack_1a0._M_allocated_capacity = 0;
    local_200._0_8_ = "vAddr1.at(0).nTime == start_time";
    local_200.m_message.px = (element_type *)0xe543e7;
    addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
    addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
    addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_2c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_2c0 = "";
    pvVar12 = (iterator)0x1;
    pvVar13 = (iterator)0x0;
    addr_v2.super_CService.super_CNetAddr._24_8_ = (lazy_ostream *)&local_200;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1b0,(lazy_ostream *)&addr_v2,1,0,WARN,_cVar14,
               (size_t)&local_2c8,0x446);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_1a0);
    local_2d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_2d0 = "";
    local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x447;
    file_03.m_begin = (iterator)&local_2d8;
    msg_03.m_end = pvVar13;
    msg_03.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2e8,
               msg_03);
    local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
    local_200._0_8_ = &PTR__lazy_ostream_013abb30;
    local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1e8 = (direct_or_indirect *)0xf6cf21;
    lVar11 = (long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar11 == 0) goto LAB_0024fd65;
    vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&(vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                          super__Vector_impl_data._M_start)->nServices;
    vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ((vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
           super__Vector_impl_data._M_start)->nServices == NODE_NONE);
    local_3f8.m_message.px = (element_type *)0x0;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1c8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_1c8.m_message.px = (element_type *)0xe52ae3;
    addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
    addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
    addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
    addr_v2.super_CService.super_CNetAddr._24_8_ = &vAddr2;
    vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&vAddr4;
    local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
    local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abdf0;
    aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_1a0._8_8_ = &vAddr3;
    boost::test_tools::tt_detail::report_assertion
              (&local_3f8,(lazy_ostream *)&local_200,1,2,REQUIRE,0xe543e8,(size_t)&local_1c8,0x447,
               &addr_v2,"NODE_NONE",(assertion_result *)&local_1b0);
    boost::detail::shared_count::~shared_count(&local_3f8.m_message.pn);
    _Var3 = addrman;
    tVar6 = NodeClock::now();
    AddrMan::Connected((AddrMan *)
                       _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
                       (NodeSeconds)((long)tVar6.__d.__r / 1000000000));
    AddrMan::SetServices
              ((AddrMan *)
               addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
               super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
               super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
               NODE_NETWORK_LIMITED);
    pvVar12 = (iterator)0x0;
    pvVar13 = (iterator)0x1;
    AddrMan::GetAddr(&vAddr2,(AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                     (optional<Network>)0x0,true);
    local_310 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_308 = "";
    local_320 = &boost::unit_test::basic_cstring<char_const>::null;
    local_318 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x44d;
    file_04.m_begin = (iterator)&local_310;
    msg_04.m_end = pvVar13;
    msg_04.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_320,
               msg_04);
    local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
    local_200._0_8_ = &PTR__lazy_ostream_013abb30;
    local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1e8 = (direct_or_indirect *)0xf6cf21;
    vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(((long)vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7)
    ;
    vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&vAddr6;
    local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ((long)vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_start == 0x38);
    vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_3f8.m_message.px = (element_type *)0x0;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
    local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
    local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x7d;
    local_1c8._1_7_ = 0xe52a;
    local_1c8.m_message.px = (element_type *)0xe52ae3;
    vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&vAddr5;
    addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
    addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
    addr_v2.super_CService.super_CNetAddr._24_8_ = &vAddr3;
    local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abbb0;
    aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_1a0._8_8_ = &vAddr4;
    pvVar12 = (iterator)0x1;
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_3f8,(lazy_ostream *)&local_200,1,2,REQUIRE,0xe54409,(size_t)&local_1c8,0x44d,
               &addr_v2,"1U",(assertion_result *)&local_1b0);
    boost::detail::shared_count::~shared_count(&local_3f8.m_message.pn);
    local_330 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_328 = "";
    local_340 = &boost::unit_test::basic_cstring<char_const>::null;
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar14 = 0x24e8d9;
    file_05.m_end = (iterator)0x44e;
    file_05.m_begin = (iterator)&local_330;
    msg_05.m_end = pvVar13;
    msg_05.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_340,
               msg_05);
    lVar11 = (long)vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar11 == 0) goto LAB_0024fd9e;
    local_1b0.direct[0] =
         lVar10 + lVar7 <=
         ((vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
           super__Vector_impl_data._M_start)->nTime).__d.__r;
    local_1b0._8_8_ = (element_type *)0x0;
    aStack_1a0._M_allocated_capacity = 0;
    local_200._0_8_ = "vAddr2.at(0).nTime >= start_time + 10000s";
    local_200.m_message.px = (element_type *)0xe54440;
    addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
    addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
    addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_350 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_348 = "";
    pvVar12 = (iterator)0x1;
    pvVar13 = (iterator)0x0;
    addr_v2.super_CService.super_CNetAddr._24_8_ = (lazy_ostream *)&local_200;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1b0,(lazy_ostream *)&addr_v2,1,0,WARN,_cVar14,
               (size_t)&local_350,0x44e);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_1a0);
    local_360 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_358 = "";
    local_370 = &boost::unit_test::basic_cstring<char_const>::null;
    local_368 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x44f;
    file_06.m_begin = (iterator)&local_360;
    msg_06.m_end = pvVar13;
    msg_06.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_370,
               msg_06);
    local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
    local_200._0_8_ = &PTR__lazy_ostream_013abb30;
    local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1e8 = (direct_or_indirect *)0xf6cf21;
    lVar7 = (long)vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar7 == 0) goto LAB_0024fdd7;
    vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&(vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                          super__Vector_impl_data._M_start)->nServices;
    vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x400;
    local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
           super__Vector_impl_data._M_start)->nServices == NODE_NETWORK_LIMITED);
    local_3f8.m_message.px = (element_type *)0x0;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1c8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_1c8.m_message.px = (element_type *)0xe52ae3;
    addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
    addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
    addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
    addr_v2.super_CService.super_CNetAddr._24_8_ = &vAddr3;
    vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&vAddr5;
    local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
    local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abdf0;
    aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_1a0._8_8_ = &vAddr4;
    pvVar12 = (iterator)0x1;
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_3f8,(lazy_ostream *)&local_200,1,2,REQUIRE,0xe54441,(size_t)&local_1c8,0x44f,
               &addr_v2,"NODE_NETWORK_LIMITED",(assertion_result *)&local_1b0);
    boost::detail::shared_count::~shared_count(&local_3f8.m_message.pn);
    local_1b0.indirect_contents.indirect = (char *)(shared_count *)&aStack_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"250.1.1.1","");
    ResolveService((CService *)&local_178.indirect_contents,(string *)&local_1b0,0x208d);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_v2,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178.indirect_contents);
    addr_v2.super_CService.super_CNetAddr.m_net = local_160;
    addr_v2.super_CService.super_CNetAddr.m_scope_id = uStack_15c;
    addr_v2.super_CService.port = local_158;
    addr_v2.nTime.__d.__r = (duration)100000000;
    addr_v2.nServices = NODE_P2P_V2;
    if (0x10 < local_168) {
      free(local_178.indirect_contents.indirect);
      local_178.indirect_contents.indirect = (char *)0x0;
    }
    if ((shared_count *)local_1b0.indirect_contents.indirect != (shared_count *)&aStack_1a0) {
      operator_delete(local_1b0.indirect_contents.indirect,
                      (ulong)(aStack_1a0._M_allocated_capacity + 1));
    }
    local_380 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_378 = "";
    local_390.__d.__r = (duration)&boost::unit_test::basic_cstring<char_const>::null;
    local_388 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x454;
    file_07.m_begin = (iterator)&local_380;
    msg_07.m_end = pvVar13;
    msg_07.m_begin = pvVar12;
    addr_v2.nTime.__d.__r = (duration)(duration)dVar8.__r;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_390,
               msg_07);
    _Var3 = addrman;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1b0,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_v2);
    aStack_1a0._8_4_ = addr_v2.super_CService.super_CNetAddr.m_net;
    aStack_1a0._12_4_ = addr_v2.super_CService.super_CNetAddr.m_scope_id;
    local_190 = addr_v2.super_CService.port;
    local_188 = (NodeSeconds)(NodeSeconds)addr_v2.nTime.__d.__r;
    SStack_180 = addr_v2.nServices;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_1b0;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1c8,__l_00,
               (allocator_type *)&vAddr4);
    _cVar14 = 0x24ec97;
    bVar5 = AddrMan::Add((AddrMan *)
                         _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                         _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                         super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                         (vector<CAddress,_std::allocator<CAddress>_> *)&local_1c8,&source,
                         (seconds)0x0);
    local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)!bVar5;
    local_3f8.m_message.px = (element_type *)0x0;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_1a41d9;
    vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xe54478;
    local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
    local_200._0_8_ = &PTR__lazy_ostream_013abc70;
    local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1e8 = (direct_or_indirect *)&vAddr3;
    local_3a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_398 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_3f8,(lazy_ostream *)&local_200,1,0,WARN,_cVar14,(size_t)&local_3a0,0x454);
    boost::detail::shared_count::~shared_count(&local_3f8.m_message.pn);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1c8);
    if (0x10 < (uint)aStack_1a0._M_allocated_capacity._0_4_) {
      free(local_1b0.indirect_contents.indirect);
      local_1b0.indirect_contents.indirect = (char *)0x0;
    }
    pvVar12 = (iterator)0x0;
    pvVar13 = (iterator)0x1;
    AddrMan::GetAddr(&vAddr3,(AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                     (optional<Network>)0x0,true);
    local_3c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_3c0 = "";
    local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x456;
    file_08.m_begin = (iterator)&local_3c8;
    msg_08.m_end = pvVar13;
    msg_08.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3d8,
               msg_08);
    local_3f8.m_message.px = (element_type *)((ulong)local_3f8.m_message.px & 0xffffffffffffff00);
    local_3f8._0_8_ = &PTR__lazy_ostream_013abb30;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3e0 = "";
    local_1d8.indirect_contents.indirect =
         (char *)(((long)vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
    vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_1d8;
    vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_1e0;
    local_1e0._0_4_ = 1;
    local_1c8.m_message.px = (element_type *)0x0;
    local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
    local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
    vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_17c7b1;
    vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xe52ae3;
    local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abb70;
    aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_1a0._8_8_ = &vAddr5;
    local_200._0_8_ = &PTR__lazy_ostream_013abbb0;
    local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar12 = (iterator)0x1;
    pvVar13 = (iterator)0x2;
    local_1e8 = (direct_or_indirect *)&vAddr6;
    local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((long)vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_start == 0x38);
    boost::test_tools::tt_detail::report_assertion
              (&local_1c8,(lazy_ostream *)&local_3f8,1,2,REQUIRE,0xe54479,(size_t)&vAddr4,0x456,
               (iterator)&local_1b0,"1U",(lazy_ostream *)&local_200);
    boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
    local_408 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_400 = "";
    local_418 = &boost::unit_test::basic_cstring<char_const>::null;
    local_410 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x457;
    file_09.m_begin = (iterator)&local_408;
    msg_09.m_end = pvVar13;
    msg_09.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_418,
               msg_09);
    local_3f8.m_message.px = (element_type *)((ulong)local_3f8.m_message.px & 0xffffffffffffff00);
    local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x30;
    local_3f8._1_7_ = 0x13abb;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3e0 = "";
    lVar7 = (long)vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar7 == 0) goto LAB_0024fe10;
    vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&(vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                          super__Vector_impl_data._M_start)->nServices;
    local_1d8.indirect_contents.indirect = (char *)0xc00;
    local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ((vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
           super__Vector_impl_data._M_start)->nServices == (NODE_P2P_V2|NODE_NETWORK_LIMITED));
    local_1c8.m_message.px = (element_type *)0x0;
    local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_17c7b1;
    vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xe52ae3;
    local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
    local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abdf0;
    aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_1a0._8_8_ = &vAddr5;
    vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_1d8;
    local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
    local_200._0_8_ = &PTR__lazy_ostream_013abb70;
    local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1e8 = (direct_or_indirect *)&vAddr6;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c8,(lazy_ostream *)&local_3f8,1,2,REQUIRE,0xe54487,(size_t)&vAddr4,0x457,
               (iterator)&local_1b0,"NODE_P2P_V2 | NODE_NETWORK_LIMITED",(lazy_ostream *)&local_200)
    ;
    boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
    AddrMan::SetServices
              ((AddrMan *)
               addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
               super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
               super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
               NODE_NETWORK);
    pvVar12 = (iterator)0x0;
    pvVar13 = (iterator)0x1;
    AddrMan::GetAddr(&vAddr4,(AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                     (optional<Network>)0x0,true);
    local_440 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_438 = "";
    local_450 = &boost::unit_test::basic_cstring<char_const>::null;
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x45c;
    file_10.m_begin = (iterator)&local_440;
    msg_10.m_end = pvVar13;
    msg_10.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_450,
               msg_10);
    local_3f8.m_message.px = (element_type *)((ulong)local_3f8.m_message.px & 0xffffffffffffff00);
    local_3f8._0_8_ = &PTR__lazy_ostream_013abb30;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3e0 = "";
    local_1e0 = (undefined1  [8])
                (((long)vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
    local_1d8.indirect_contents.indirect = local_208;
    local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ((long)vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_start == 0x38);
    local_208._0_4_ = 1;
    local_1c8.m_message.px = (element_type *)0x0;
    local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
    local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
    vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_17c7b1;
    vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xe52ae3;
    vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_1e0;
    local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abb70;
    aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_200._0_8_ = &PTR__lazy_ostream_013abbb0;
    local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1e8 = &local_1d8;
    pvVar12 = (iterator)0x1;
    pvVar13 = (iterator)0x2;
    aStack_1a0._8_8_ = (direct_or_indirect *)&vAddr6;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c8,(lazy_ostream *)&local_3f8,1,2,REQUIRE,0xe544c1,(size_t)&vAddr5,0x45c,
               (iterator)&local_1b0,"1U",(lazy_ostream *)&local_200);
    boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
    local_460 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_458 = "";
    local_470 = &boost::unit_test::basic_cstring<char_const>::null;
    local_468 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x45d;
    file_11.m_begin = (iterator)&local_460;
    msg_11.m_end = pvVar13;
    msg_11.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_470,
               msg_11);
    local_3f8.m_message.px = (element_type *)((ulong)local_3f8.m_message.px & 0xffffffffffffff00);
    local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x30;
    local_3f8._1_7_ = 0x13abb;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3e0 = "";
    lVar7 = (long)vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar7 == 0) goto LAB_0024fe49;
    vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&(vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                          super__Vector_impl_data._M_start)->nServices;
    local_1e0 = (undefined1  [8])0x1;
    local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ((vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
           super__Vector_impl_data._M_start)->nServices == NODE_NETWORK);
    local_1c8.m_message.px = (element_type *)0x0;
    local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_17c7b1;
    vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xe52ae3;
    local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
    local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abdf0;
    aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_1a0._8_8_ = &vAddr6;
    local_1d8.indirect_contents.indirect = local_1e0;
    local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
    local_200._0_8_ = &PTR__lazy_ostream_013abdf0;
    local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1e8 = &local_1d8;
    pvVar12 = (iterator)0x1;
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c8,(lazy_ostream *)&local_3f8,1,2,REQUIRE,0xe544cf,(size_t)&vAddr5,0x45d,
               (iterator)&local_1b0,"NODE_NETWORK",(lazy_ostream *)&local_200);
    boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
    local_480 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_478 = "";
    local_490.__d.__r = (duration)&boost::unit_test::basic_cstring<char_const>::null;
    local_488 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x460;
    file_12.m_begin = (iterator)&local_480;
    msg_12.m_end = pvVar13;
    msg_12.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_490,
               msg_12);
    _Var3 = addrman;
    tVar6 = NodeClock::now();
    _cVar14 = 0x24f3fb;
    bVar5 = AddrMan::Good((AddrMan *)
                          _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                          _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
                          (NodeSeconds)((long)tVar6.__d.__r / 1000000000));
    local_200.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar5;
    local_200.m_message.px = (element_type *)0x0;
    local_200.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_3f8._0_8_ = "addrman->Good(addr)";
    local_3f8.m_message.px = (element_type *)0xe53f8c;
    local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
    local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abc70;
    aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_4a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_498 = "";
    aStack_1a0._8_8_ = (lazy_ostream *)&local_3f8;
    boost::test_tools::tt_detail::report_assertion
              (&local_200,(lazy_ostream *)&local_1b0,1,0,WARN,_cVar14,(size_t)&local_4a0,0x460);
    boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
    pvVar12 = (iterator)0x0;
    pvVar13 = (iterator)0x1;
    AddrMan::GetAddr(&vAddr5,(AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                     (optional<Network>)0x0,true);
    local_4c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_4c0 = "";
    local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x462;
    file_13.m_begin = (iterator)&local_4c8;
    msg_13.m_end = pvVar13;
    msg_13.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4d8,
               msg_13);
    local_3f8.m_message.px = (element_type *)((ulong)local_3f8.m_message.px & 0xffffffffffffff00);
    local_3f8._0_8_ = &PTR__lazy_ostream_013abb30;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3e0 = "";
    local_208 = (undefined1  [8])
                (((long)vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
    local_1e0 = (undefined1  [8])&local_568;
    local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ((long)vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_start == 0x38);
    local_568 = CONCAT44(local_568._4_4_,1);
    local_1c8.m_message.px = (element_type *)0x0;
    local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
    local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
    vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_17c7b1;
    vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xe52ae3;
    local_1d8.indirect_contents.indirect = local_208;
    local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abb70;
    aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_1a0._8_8_ = &local_1d8;
    local_200._0_8_ = &PTR__lazy_ostream_013abbb0;
    local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1e8 = (direct_or_indirect *)local_1e0;
    pvVar12 = (iterator)0x1;
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c8,(lazy_ostream *)&local_3f8,1,2,REQUIRE,0xe544f3,(size_t)&vAddr6,0x462,
               (lazy_ostream *)&local_1b0,"1U",&local_200);
    boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
    local_4e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_4e0 = "";
    local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_14.m_end = (iterator)0x463;
    file_14.m_begin = (iterator)&local_4e8;
    msg_14.m_end = pvVar13;
    msg_14.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_4f8,
               msg_14);
    local_3f8.m_message.px = (element_type *)((ulong)local_3f8.m_message.px & 0xffffffffffffff00);
    local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x30;
    local_3f8._1_7_ = 0x13abb;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3e0 = "";
    lVar7 = (long)vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar7 == 0) goto LAB_0024fe82;
    local_1d8.indirect_contents.indirect =
         (char *)&(vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                   super__Vector_impl_data._M_start)->nServices;
    local_208 = (undefined1  [8])0x1;
    local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
           super__Vector_impl_data._M_start)->nServices == NODE_NETWORK);
    local_1c8.m_message.px = (element_type *)0x0;
    local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_17c7b1;
    vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xe52ae3;
    local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
    local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abdf0;
    aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_1a0._8_8_ = &local_1d8;
    local_1e0 = (undefined1  [8])local_208;
    local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
    local_200._0_8_ = &PTR__lazy_ostream_013abdf0;
    local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1e8 = (direct_or_indirect *)local_1e0;
    pvVar12 = (iterator)0x1;
    pvVar13 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_1c8,(lazy_ostream *)&local_3f8,1,2,REQUIRE,0xe54501,(size_t)&vAddr6,0x463,
               (lazy_ostream *)&local_1b0,"NODE_NETWORK",&local_200);
    boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
    local_508 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_500 = "";
    local_518.__d.__r = (duration)&boost::unit_test::basic_cstring<char_const>::null;
    local_510 = &boost::unit_test::basic_cstring<char_const>::null;
    file_15.m_end = (iterator)0x466;
    file_15.m_begin = (iterator)&local_508;
    msg_15.m_end = pvVar13;
    msg_15.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_518,
               msg_15);
    _Var3 = addrman;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1b0,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_v2);
    aStack_1a0._8_4_ = addr_v2.super_CService.super_CNetAddr.m_net;
    aStack_1a0._12_4_ = addr_v2.super_CService.super_CNetAddr.m_scope_id;
    local_190 = addr_v2.super_CService.port;
    local_188 = (NodeSeconds)(NodeSeconds)addr_v2.nTime.__d.__r;
    SStack_180 = addr_v2.nServices;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_1b0;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1c8,__l_01,
               (allocator_type *)&local_1d8.indirect_contents);
    _cVar14 = 0x24f878;
    bVar5 = AddrMan::Add((AddrMan *)
                         _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                         _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                         super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                         (vector<CAddress,_std::allocator<CAddress>_> *)&local_1c8,&source,
                         (seconds)0x0);
    local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)!bVar5;
    local_3f8.m_message.px = (element_type *)0x0;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_1a41d9;
    vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xe54478;
    local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
    local_200._0_8_ = &PTR__lazy_ostream_013abc70;
    local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_528 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_520 = "";
    local_1e8 = (direct_or_indirect *)&vAddr6;
    boost::test_tools::tt_detail::report_assertion
              (&local_3f8,(lazy_ostream *)&local_200,1,0,WARN,_cVar14,(size_t)&local_528,0x466);
    boost::detail::shared_count::~shared_count(&local_3f8.m_message.pn);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1c8);
    if (0x10 < (uint)aStack_1a0._M_allocated_capacity._0_4_) {
      free(local_1b0.indirect_contents.indirect);
      local_1b0.indirect_contents.indirect = (char *)0x0;
    }
    pvVar12 = (iterator)0x0;
    pvVar13 = (iterator)0x1;
    AddrMan::GetAddr(&vAddr6,(AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                     (optional<Network>)0x0,true);
    local_550 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_548 = "";
    local_560 = &boost::unit_test::basic_cstring<char_const>::null;
    local_558 = &boost::unit_test::basic_cstring<char_const>::null;
    file_16.m_end = (iterator)0x468;
    file_16.m_begin = (iterator)&local_550;
    msg_16.m_end = pvVar13;
    msg_16.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_560,
               msg_16);
    local_568 = ((long)vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    local_208 = (undefined1  [8])&local_56c;
    local_56c = NODE_NETWORK;
    local_3f8.m_message.px = (element_type *)((ulong)local_3f8.m_message.px & 0xffffffffffffff00);
    local_3f8._0_8_ = &PTR__lazy_ostream_013abb30;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3e0 = "";
    local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
    local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
    local_1c8.m_message.px = (element_type *)0x0;
    local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_200._0_8_ = &PTR__lazy_ostream_013abbb0;
    local_1d8.indirect_contents.indirect =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_1d8._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
         + 0x66;
    local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abb70;
    aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_1a0._8_8_ = local_1e0;
    local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1e8 = (direct_or_indirect *)local_208;
    pvVar12 = (iterator)0x1;
    pvVar13 = (iterator)0x2;
    local_1e0 = (undefined1  [8])&local_568;
    local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((long)vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_start == 0x38);
    boost::test_tools::tt_detail::report_assertion
              (&local_1c8,(lazy_ostream *)&local_3f8,1,2,REQUIRE,0xe54518,(size_t)&local_1d8,0x468,
               (iterator)&local_1b0,"1U",(lazy_ostream *)&local_200);
    boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
    local_580 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_578 = "";
    local_590 = &boost::unit_test::basic_cstring<char_const>::null;
    local_588 = &boost::unit_test::basic_cstring<char_const>::null;
    file_17.m_end = (iterator)0x469;
    file_17.m_begin = (iterator)&local_580;
    msg_17.m_end = pvVar13;
    msg_17.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_590,
               msg_17);
    local_3f8.m_message.px = (element_type *)((ulong)local_3f8.m_message.px & 0xffffffffffffff00);
    local_3f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x30;
    local_3f8._1_7_ = 0x13abb;
    local_3f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3e0 = "";
    lVar7 = (long)vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar7 != 0) {
      local_1e0 = (undefined1  [8])
                  &(vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_start)->nServices;
      local_568 = NODE_P2P_V2|NODE_NETWORK;
      local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           ((vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start)->nServices == (NODE_P2P_V2|NODE_NETWORK));
      local_1c8.m_message.px = (element_type *)0x0;
      local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1d8.indirect_contents.indirect =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_1d8._8_8_ =
           (long)
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
           + 0x66;
      local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
      local_1b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abdf0;
      aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_1a0._8_8_ = local_1e0;
      local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
      local_200._0_8_ = &PTR__lazy_ostream_013abb70;
      local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_1e8 = (direct_or_indirect *)local_208;
      local_208 = (undefined1  [8])&local_568;
      boost::test_tools::tt_detail::report_assertion
                (&local_1c8,(lazy_ostream *)&local_3f8,1,2,REQUIRE,0xe54526,(size_t)&local_1d8,0x469
                 ,(iterator)&local_1b0,"NODE_NETWORK | NODE_P2P_V2",(lazy_ostream *)&local_200);
      boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr6);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr5);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr4);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr3);
      if (0x10 < addr_v2.super_CService.super_CNetAddr.m_addr._size) {
        free(addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0
        ;
      }
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr2);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr1);
      if (0x10 < addr_diff_port.super_CService.super_CNetAddr.m_addr._size) {
        free(addr_diff_port.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        addr_diff_port.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
             (char *)0x0;
      }
      if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
        free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < source.m_addr._size) {
        free(source.m_addr._union.indirect_contents.indirect);
        source.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      goto LAB_00250459;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    uVar9 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,(lVar7 >> 3) * 0x6db6db6db6db6db7);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr6);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr5);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr4);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr3);
    if (0x10 < addr_v2.super_CService.super_CNetAddr.m_addr._size) {
      free(addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr2);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr1);
    if (0x10 < addr_diff_port.super_CService.super_CNetAddr.m_addr._size) {
      free(addr_diff_port.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      addr_diff_port.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           (char *)0x0;
    }
    if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
      free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < source.m_addr._size) {
      free(source.m_addr._union.indirect_contents.indirect);
      source.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      _Unwind_Resume(uVar9);
    }
  }
LAB_00250459:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_update_address)
{
    // Tests updating nTime via Connected() and nServices via SetServices() and Add()
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    CNetAddr source{ResolveIP("252.2.2.2")};
    CAddress addr{CAddress(ResolveService("250.1.1.1", 8333), NODE_NONE)};

    const auto start_time{Now<NodeSeconds>() - 10000s};
    addr.nTime = start_time;
    BOOST_CHECK(addrman->Add({addr}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    // Updating an addrman entry with a different port doesn't change it
    CAddress addr_diff_port{CAddress(ResolveService("250.1.1.1", 8334), NODE_NONE)};
    addr_diff_port.nTime = start_time;
    addrman->Connected(addr_diff_port);
    addrman->SetServices(addr_diff_port, NODE_NETWORK_LIMITED);
    std::vector<CAddress> vAddr1{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr1.size(), 1U);
    BOOST_CHECK(vAddr1.at(0).nTime == start_time);
    BOOST_CHECK_EQUAL(vAddr1.at(0).nServices, NODE_NONE);

    // Updating an addrman entry with the correct port is successful
    addrman->Connected(addr);
    addrman->SetServices(addr, NODE_NETWORK_LIMITED);
    std::vector<CAddress> vAddr2 = addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt);
    BOOST_CHECK_EQUAL(vAddr2.size(), 1U);
    BOOST_CHECK(vAddr2.at(0).nTime >= start_time + 10000s);
    BOOST_CHECK_EQUAL(vAddr2.at(0).nServices, NODE_NETWORK_LIMITED);

    // Updating an existing addr through Add() (used in gossip relay) can add additional services but can't remove existing ones.
    CAddress addr_v2{CAddress(ResolveService("250.1.1.1", 8333), NODE_P2P_V2)};
    addr_v2.nTime = start_time;
    BOOST_CHECK(!addrman->Add({addr_v2}, source));
    std::vector<CAddress> vAddr3{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr3.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr3.at(0).nServices, NODE_P2P_V2 | NODE_NETWORK_LIMITED);

    // SetServices() (used when we connected to them) overwrites existing service flags
    addrman->SetServices(addr, NODE_NETWORK);
    std::vector<CAddress> vAddr4{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr4.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr4.at(0).nServices, NODE_NETWORK);

    // Promoting to Tried does not affect the service flags
    BOOST_CHECK(addrman->Good(addr)); // addr has NODE_NONE
    std::vector<CAddress> vAddr5{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr5.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr5.at(0).nServices, NODE_NETWORK);

    // Adding service flags even works when the addr is in Tried
    BOOST_CHECK(!addrman->Add({addr_v2}, source));
    std::vector<CAddress> vAddr6{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr6.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr6.at(0).nServices, NODE_NETWORK | NODE_P2P_V2);
}